

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructReader * __thiscall capnp::_::StructBuilder::asReader(StructBuilder *this)

{
  StructPointerCount SVar1;
  StructDataBitCount SVar2;
  CapTableReader *pCVar3;
  WirePointer *pWVar4;
  StructReader *in_RDI;
  
  SVar2 = this->dataSize;
  SVar1 = this->pointerCount;
  pCVar3 = &this->capTable->super_CapTableReader;
  in_RDI->segment = &this->segment->super_SegmentReader;
  in_RDI->capTable = pCVar3;
  pWVar4 = this->pointers;
  in_RDI->data = this->data;
  in_RDI->pointers = pWVar4;
  in_RDI->dataSize = SVar2;
  in_RDI->pointerCount = SVar1;
  in_RDI->nestingLimit = 0x7fffffff;
  return in_RDI;
}

Assistant:

StructReader StructBuilder::asReader() const {
  return StructReader(segment, capTable, data, pointers,
      dataSize, pointerCount, kj::maxValue);
}